

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

ValidateXrFlagsResult ValidateXrCompositionLayerFlags(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = (value < 0x10) + VALIDATE_XR_FLAGS_INVALID;
  if (value == 0) {
    VVar1 = VALIDATE_XR_FLAGS_ZERO;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrCompositionLayerFlags(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_COMPOSITION_LAYER_CORRECT_CHROMATIC_ABERRATION_BIT) != 0) {
        // Clear the value XR_COMPOSITION_LAYER_CORRECT_CHROMATIC_ABERRATION_BIT since it is valid
        int_value &= ~XR_COMPOSITION_LAYER_CORRECT_CHROMATIC_ABERRATION_BIT;
    }
    if ((int_value & XR_COMPOSITION_LAYER_BLEND_TEXTURE_SOURCE_ALPHA_BIT) != 0) {
        // Clear the value XR_COMPOSITION_LAYER_BLEND_TEXTURE_SOURCE_ALPHA_BIT since it is valid
        int_value &= ~XR_COMPOSITION_LAYER_BLEND_TEXTURE_SOURCE_ALPHA_BIT;
    }
    if ((int_value & XR_COMPOSITION_LAYER_UNPREMULTIPLIED_ALPHA_BIT) != 0) {
        // Clear the value XR_COMPOSITION_LAYER_UNPREMULTIPLIED_ALPHA_BIT since it is valid
        int_value &= ~XR_COMPOSITION_LAYER_UNPREMULTIPLIED_ALPHA_BIT;
    }
    if ((int_value & XR_COMPOSITION_LAYER_INVERTED_ALPHA_BIT_EXT) != 0) {
        // Clear the value XR_COMPOSITION_LAYER_INVERTED_ALPHA_BIT_EXT since it is valid
        int_value &= ~XR_COMPOSITION_LAYER_INVERTED_ALPHA_BIT_EXT;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}